

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_symbol_for(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue JVar1;
  
  JVar1 = JS_ToStringInternal(ctx,*argv,0);
  if ((int)JVar1.tag == 6) {
    JVar1 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    JVar1 = JS_NewSymbol(ctx,(JSString *)JVar1.u.ptr,2);
  }
  return JVar1;
}

Assistant:

static JSValue js_symbol_for(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    JSValue str;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return JS_EXCEPTION;
    return JS_NewSymbol(ctx, JS_VALUE_GET_STRING(str), JS_ATOM_TYPE_GLOBAL_SYMBOL);
}